

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ALSADriver.cpp
# Opt level: O0

bool __thiscall
ALSAMidiDriver::processSeqEvent
          (ALSAMidiDriver *this,snd_seq_event_t *seq_event,MidiSession *midiSession)

{
  SynthRoute *pSVar1;
  uint uVar2;
  SynthRoute *pSVar3;
  MasterClockNanos MVar4;
  uchar *puVar5;
  qsizetype qVar6;
  QMessageLogger local_e0;
  QDebug local_c0;
  QMessageLogger local_b8;
  QDebug local_98 [3];
  QMessageLogger local_80;
  QDebug local_60;
  MidiSession *local_58;
  MidiSession *midiSession_1;
  byte local_46;
  undefined1 local_45;
  uint clientAddr;
  bool hasSysexEnd;
  bool hasSysexStart;
  uchar *puStack_40;
  uint sysexLength;
  Bit8u *sysexData;
  int bend;
  Bit32u msg;
  SynthRoute *synthRoute;
  MidiSession *midiSession_local;
  snd_seq_event_t *seq_event_local;
  ALSAMidiDriver *this_local;
  
  synthRoute = (SynthRoute *)midiSession;
  midiSession_local = (MidiSession *)seq_event;
  seq_event_local = (snd_seq_event_t *)this;
  pSVar3 = MidiSession::getSynthRoute(midiSession);
  pSVar1 = synthRoute;
  sysexData._4_4_ = 0;
  _bend = pSVar3;
  switch(midiSession_local->super_QObject) {
  case (QObject)0x5:
    break;
  case (QObject)0x6:
    uVar2 = (uint)*(byte *)((long)&midiSession_local->midiDriver + 2) << 0x10 |
            (uint)*(byte *)((long)&midiSession_local->midiDriver + 1) << 8 |
            *(byte *)&midiSession_local->midiDriver | 0x90;
    sysexData._4_4_ = uVar2;
    MVar4 = MasterClock::getClockNanos();
    SynthRoute::pushMIDIShortMessage(pSVar3,(MidiSession *)pSVar1,uVar2,MVar4);
    break;
  case (QObject)0x7:
    uVar2 = (uint)*(byte *)((long)&midiSession_local->midiDriver + 2) << 0x10 |
            (uint)*(byte *)((long)&midiSession_local->midiDriver + 1) << 8 |
            *(byte *)&midiSession_local->midiDriver | 0x80;
    sysexData._4_4_ = uVar2;
    MVar4 = MasterClock::getClockNanos();
    SynthRoute::pushMIDIShortMessage(pSVar3,(MidiSession *)pSVar1,uVar2,MVar4);
    break;
  default:
    break;
  case (QObject)0xa:
    uVar2 = *(int *)&(midiSession_local->name).d.d << 0x10 |
            *(int *)((long)&midiSession_local->midiDriver + 4) << 8 |
            *(byte *)&midiSession_local->midiDriver | 0xb0;
    sysexData._4_4_ = uVar2;
    MVar4 = MasterClock::getClockNanos();
    SynthRoute::pushMIDIShortMessage(pSVar3,(MidiSession *)pSVar1,uVar2,MVar4);
    break;
  case (QObject)0xb:
    uVar2 = *(int *)&(midiSession_local->name).d.d << 8 |
            *(byte *)&midiSession_local->midiDriver | 0xc0;
    sysexData._4_4_ = uVar2;
    MVar4 = MasterClock::getClockNanos();
    SynthRoute::pushMIDIShortMessage(pSVar3,(MidiSession *)pSVar1,uVar2,MVar4);
    break;
  case (QObject)0xd:
    sysexData._0_4_ = *(int *)&(midiSession_local->name).d.d + 0x2000;
    uVar2 = ((int)(uint)sysexData >> 7 & 0x7fU) << 0x10 |
            ((uint)sysexData & 0x7f) << 8 | *(byte *)&midiSession_local->midiDriver | 0xe0;
    sysexData._4_4_ = uVar2;
    MVar4 = MasterClock::getClockNanos();
    SynthRoute::pushMIDIShortMessage(pSVar3,(MidiSession *)pSVar1,uVar2,MVar4);
    break;
  case (QObject)0xe:
    if (((ulong)midiSession_local->midiDriver & 0xe000000000) != 0x2000000000) {
      uVar2 = (*(int *)&(midiSession_local->name).d.d >> 7) << 0x10 |
              *(int *)((long)&midiSession_local->midiDriver + 4) << 8 |
              *(byte *)&midiSession_local->midiDriver | 0xb0;
      sysexData._4_4_ = uVar2;
      MVar4 = MasterClock::getClockNanos();
      SynthRoute::pushMIDIShortMessage(pSVar3,(MidiSession *)pSVar1,uVar2,MVar4);
    }
    break;
  case (QObject)0xf:
    break;
  case (QObject)0x10:
    if (*(int *)((long)&midiSession_local->midiDriver + 4) == 0) {
      uVar2 = *(byte *)&midiSession_local->midiDriver | 0x64b0;
      sysexData._4_4_ = uVar2;
      MVar4 = MasterClock::getClockNanos();
      SynthRoute::pushMIDIShortMessage(pSVar3,(MidiSession *)pSVar1,uVar2,MVar4);
      pSVar3 = synthRoute;
      pSVar1 = _bend;
      uVar2 = sysexData._4_4_ & 0xff | 0x6500;
      sysexData._4_4_ = uVar2;
      MVar4 = MasterClock::getClockNanos();
      SynthRoute::pushMIDIShortMessage(pSVar1,(MidiSession *)pSVar3,uVar2,MVar4);
      pSVar3 = synthRoute;
      pSVar1 = _bend;
      uVar2 = (*(int *)&(midiSession_local->name).d.d >> 7 & 0x7fU) << 0x10 |
              sysexData._4_4_ & 0xff | 0x600;
      sysexData._4_4_ = uVar2;
      MVar4 = MasterClock::getClockNanos();
      SynthRoute::pushMIDIShortMessage(pSVar1,(MidiSession *)pSVar3,uVar2,MVar4);
    }
    break;
  case (QObject)0x3c:
    QMessageLogger::QMessageLogger(&local_80,(char *)0x0,0,(char *)0x0);
    QMessageLogger::debug();
    QDebug::operator<<(&local_60,"ALSAMidiDriver: Client start");
    QDebug::~QDebug(&local_60);
    break;
  case (QObject)0x3d:
    QMessageLogger::QMessageLogger(&local_e0,(char *)0x0,0,(char *)0x0);
    QMessageLogger::debug();
    QDebug::operator<<(&local_c0,"ALSAMidiDriver: Client exit");
    QDebug::~QDebug(&local_c0);
    return true;
  case (QObject)0x3e:
    QMessageLogger::QMessageLogger(&local_b8,(char *)0x0,0,(char *)0x0);
    QMessageLogger::debug();
    QDebug::operator<<(local_98,"ALSAMidiDriver: Client change");
    QDebug::~QDebug(local_98);
    break;
  case (QObject)0x42:
    break;
  case (QObject)0x43:
    midiSession_1._4_4_ = getSourceAddr(this,(snd_seq_event_t *)midiSession_local);
    local_58 = findMidiSessionForClient(this,midiSession_1._4_4_);
    if (local_58 != (MidiSession *)0x0) {
      MidiDriver::deleteMidiSession(&this->super_MidiDriver,local_58);
    }
    QList<unsigned_int>::removeAll<unsigned_int>(&this->clients,(uint *)((long)&midiSession_1 + 4));
    break;
  case (QObject)0x82:
    puVar5 = *(uchar **)((long)&midiSession_local->midiDriver + 4);
    uVar2 = *(uint *)&midiSession_local->midiDriver;
    if (uVar2 != 0) {
      local_45 = *puVar5 == 0xf0;
      local_46 = puVar5[uVar2 - 1] == 0xf7;
      clientAddr = uVar2;
      puStack_40 = puVar5;
      if (((bool)local_45) && ((bool)local_46)) {
        MVar4 = MasterClock::getClockNanos();
        SynthRoute::pushMIDISysex(pSVar3,(MidiSession *)pSVar1,puVar5,uVar2,MVar4);
      }
      else {
        QVarLengthArray<unsigned_char,_1000LL>::append(&this->sysexBuffer,puVar5,(ulong)uVar2);
        pSVar3 = synthRoute;
        pSVar1 = _bend;
        if ((local_46 & 1) != 0) {
          puVar5 = QVarLengthArray<unsigned_char,_1000LL>::constData(&this->sysexBuffer);
          qVar6 = QVarLengthArray<unsigned_char,_1000LL>::size(&this->sysexBuffer);
          MVar4 = MasterClock::getClockNanos();
          SynthRoute::pushMIDISysex(pSVar1,(MidiSession *)pSVar3,puVar5,(uint)qVar6,MVar4);
          QVarLengthArray<unsigned_char,_1000LL>::clear(&this->sysexBuffer);
        }
      }
    }
  }
  return false;
}

Assistant:

bool ALSAMidiDriver::processSeqEvent(snd_seq_event_t *seq_event, MidiSession *midiSession) {
	SynthRoute *synthRoute = midiSession->getSynthRoute();
	MT32Emu::Bit32u msg = 0;
	switch(seq_event->type) {
	case SND_SEQ_EVENT_NOTEON:
		msg = 0x90;
		msg |= seq_event->data.note.channel;
		msg |= seq_event->data.note.note << 8;
		msg |= seq_event->data.note.velocity << 16;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_NOTEOFF:
		msg = 0x80;
		msg |= seq_event->data.note.channel;
		msg |= seq_event->data.note.note << 8;
		msg |= seq_event->data.note.velocity << 16;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_CONTROLLER:
		msg = 0xB0;
		msg |= seq_event->data.control.channel;
		msg |= seq_event->data.control.param << 8;
		msg |= seq_event->data.control.value << 16;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_CONTROL14:
		// The real hardware units don't support any of LSB controllers,
		// so we just send the MSB silently ignoring the LSB
		if ((seq_event->data.control.param & 0xE0) == 0x20) break;
		msg = 0xB0;
		msg |= seq_event->data.control.channel;
		msg |= seq_event->data.control.param << 8;
		msg |= (seq_event->data.control.value >> 7) << 16;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_NONREGPARAM:
		// The real hardware units don't support NRPNs
		break;

	case SND_SEQ_EVENT_REGPARAM:
		// The real hardware units support only RPN 0 (pitch bender range) and only MSB matters
		if (seq_event->data.control.param != 0) break;
		msg = 0x64B0;
		msg |= seq_event->data.control.channel;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());

		msg &= 0xFF;
		msg |= 0x6500;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());

		msg &= 0xFF;
		msg |= 0x0600;
		msg |= ((seq_event->data.control.value >> 7) & 0x7F) << 16;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_PGMCHANGE:
		msg = 0xC0;
		msg |= seq_event->data.control.channel;
		msg |= seq_event->data.control.value << 8;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_PITCHBEND:
		msg = 0xE0;
		msg |= seq_event->data.control.channel;
		int bend;
		bend = seq_event->data.control.value + 8192;
		msg |= (bend & 0x7F) << 8;
		msg |= ((bend >> 7) & 0x7F) << 16;
		synthRoute->pushMIDIShortMessage(*midiSession, msg, MasterClock::getClockNanos());
		break;

	case SND_SEQ_EVENT_SYSEX: {
		MT32Emu::Bit8u *sysexData = (MT32Emu::Bit8u *)seq_event->data.ext.ptr;
		uint sysexLength = seq_event->data.ext.len;

		if(sysexLength == 0) break; // no-op

		// We may well get a SysEx fragment, so if this is the case, it's buffered and the full SysEx is reconstructed further on.
		// If not, don't bother and take a shortcut.
		bool hasSysexStart = sysexData[0] == MIDI_CMD_COMMON_SYSEX;
		bool hasSysexEnd = sysexData[sysexLength - 1] == MIDI_CMD_COMMON_SYSEX_END;
		if (hasSysexStart && hasSysexEnd) {
			synthRoute->pushMIDISysex(*midiSession, sysexData, sysexLength, MasterClock::getClockNanos());
			break;
		}
		// OK, accumulate SysEx data received so far and commit when ready.
		sysexBuffer.append(sysexData, sysexLength);
		if (hasSysexEnd) {
			synthRoute->pushMIDISysex(*midiSession, sysexBuffer.constData(), sysexBuffer.size(), MasterClock::getClockNanos());
			sysexBuffer.clear();
		}
		break;
	}

	case SND_SEQ_EVENT_PORT_SUBSCRIBED:
		// no-op
		break;
	case SND_SEQ_EVENT_PORT_UNSUBSCRIBED:
		unsigned int clientAddr;
		clientAddr = getSourceAddr(seq_event);
		MidiSession *midiSession;
		midiSession = findMidiSessionForClient(clientAddr);
		if (midiSession != NULL) deleteMidiSession(midiSession);
		clients.removeAll(clientAddr);
		break;

	case SND_SEQ_EVENT_CLIENT_START:
		qDebug() << "ALSAMidiDriver: Client start";
		break;
	case SND_SEQ_EVENT_CLIENT_CHANGE:
		qDebug() << "ALSAMidiDriver: Client change";
		break;
	case SND_SEQ_EVENT_CLIENT_EXIT:
		qDebug() << "ALSAMidiDriver: Client exit";
		return true;

	case SND_SEQ_EVENT_NOTE:
		// FIXME: Implement these
		break;

	default:
		break;
	}
	return false;
}